

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O2

void lws_seq_destroy(lws_seq_t **pseq)

{
  lws_sequencer *d;
  
  d = *pseq;
  d->going_down = '\x01';
  (*d->cb)(d,d + 1,1,(void *)0x0,(void *)0x0);
  lws_dll2_remove(&d->seq_list);
  lws_dll2_remove(&(d->sul_timeout).list);
  lws_dll2_remove(&(d->sul_pending).list);
  lws_dll2_foreach_safe(&d->seq_event_owner,(void *)0x0,seq_ev_destroy);
  lws_realloc(d,0,"free");
  return;
}

Assistant:

void
lws_seq_destroy(lws_seq_t **pseq)
{
	lws_seq_t *seq = *pseq;

	/* defeat another thread racing to add events while we are destroying */
	seq->going_down = 1;

	seq->cb(seq, (void *)&seq[1], LWSSEQ_DESTROYED, NULL, NULL);

	lws_pt_lock(seq->pt, __func__); /* -------------------------- pt { */

	lws_dll2_remove(&seq->seq_list);
	lws_dll2_remove(&seq->sul_timeout.list);
	lws_dll2_remove(&seq->sul_pending.list);
	/* remove and destroy any pending events */
	lws_dll2_foreach_safe(&seq->seq_event_owner, NULL, seq_ev_destroy);

	lws_pt_unlock(seq->pt); /* } pt ---------------------------------- */


	lws_free_set_NULL(seq);
}